

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

int __thiscall DIntermissionScreenCast::Responder(DIntermissionScreenCast *this,event_t *ev)

{
  AActor *actor;
  bool bVar1;
  int iVar2;
  FState *this_00;
  int iVar3;
  FSoundID *sound_id;
  FSoundID local_24;
  FSoundID local_20;
  FSoundID local_1c;
  FName label [2];
  
  iVar3 = 0;
  if ((ev->type == '\x01') && (iVar3 = 1, this->castdeath == false)) {
    this->castdeath = true;
    if (this->mClass != (PClassActor *)0x0) {
      label[0].Index = 0x8c;
      label[1].Index = 0xd0;
      this_00 = PClassActor::FindState(this->mClass,2,label,false);
      this->caststate = this_00;
      if (this_00 == (FState *)0x0) {
        iVar3 = -1;
      }
      else {
        iVar2 = FState::GetTics(this_00);
        this->casttics = iVar2;
        this->castframes = 0;
        this->castattacking = false;
        bVar1 = PClass::IsAncestorOf
                          (APlayerPawn::RegistrationInfo.MyClass,&this->mClass->super_PClass);
        if (bVar1) {
          actor = (AActor *)(&players)[(long)consoleplayer * 0x54];
          local_1c.ID = S_FindSound("*death");
          iVar2 = S_FindSkinnedSound(actor,&local_1c);
          if (iVar2 == 0) {
            return 1;
          }
          sound_id = &local_20;
        }
        else {
          iVar2 = (this->mDefaults->DeathSound).super_FSoundID.ID;
          if (iVar2 == 0) {
            return 1;
          }
          sound_id = &local_24;
        }
        sound_id->ID = iVar2;
        S_Sound(0x22,sound_id,1.0,0.0);
      }
    }
  }
  return iVar3;
}

Assistant:

int DIntermissionScreenCast::Responder (event_t *ev)
{
	if (ev->type != EV_KeyDown) return 0;

	if (castdeath)
		return 1;					// already in dying frames

	castdeath = true;

	if (mClass != NULL)
	{
		FName label[] = {NAME_Death, NAME_Cast};
		caststate = mClass->FindState(2, label);
		if (caststate == NULL) return -1;

		casttics = caststate->GetTics();
		castframes = 0;
		castattacking = false;

		if (mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
		{
			int snd = S_FindSkinnedSound(players[consoleplayer].mo, "*death");
			if (snd != 0) S_Sound (CHAN_VOICE | CHAN_UI, snd, 1, ATTN_NONE);
		}
		else if (mDefaults->DeathSound)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, mDefaults->DeathSound, 1, ATTN_NONE);
		}
	}
	return true;
}